

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorUtil.h
# Opt level: O2

void jaegertracing::utils::ErrorUtil::logError(Logger *logger,string *message)

{
  undefined8 uVar1;
  long *plVar2;
  ostream *poVar3;
  char *pcVar4;
  int iVar5;
  undefined1 auVar6 [12];
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  auVar6 = __cxa_rethrow();
  iVar5 = auVar6._8_4_;
  uVar1 = auVar6._0_8_;
  if (iVar5 == 4) {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,(string *)message);
    poVar3 = std::operator<<(poVar3,": ");
    pcVar4 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,", numFailed=");
    std::ostream::operator<<((ostream *)poVar3,(int)plVar2[2]);
    std::__cxx11::stringbuf::str();
    (**(code **)(*(long *)logger + 0x10))(logger,asStack_1b8);
  }
  else if (iVar5 == 3) {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,(string *)message);
    poVar3 = std::operator<<(poVar3,": ");
    pcVar4 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,", code=");
    std::ostream::operator<<((ostream *)poVar3,(int)plVar2[2]);
    std::__cxx11::stringbuf::str();
    (**(code **)(*(long *)logger + 0x10))(logger,asStack_1b8);
  }
  else {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    if (iVar5 != 2) {
      (**(code **)(*(long *)logger + 0x10))(logger,message);
      __cxa_end_catch();
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,(string *)message);
    poVar3 = std::operator<<(poVar3,": ");
    pcVar4 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    std::operator<<(poVar3,pcVar4);
    std::__cxx11::stringbuf::str();
    (**(code **)(*(long *)logger + 0x10))(logger,asStack_1b8);
  }
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  __cxa_end_catch();
  return;
}

Assistant:

inline void logError(logging::Logger& logger, const std::string& message)
{
    try {
        throw;
    } catch (const Sender::Exception& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what() << ", numFailed=" << ex.numFailed();
        logger.error(oss.str());
    } catch (const std::system_error& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what() << ", code=" << ex.code().value();
        logger.error(oss.str());
    } catch (const std::exception& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what();
        logger.error(oss.str());
    } catch (...) {
        logger.error(message);
    }
}